

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCostSchedule::IfcCostSchedule(IfcCostSchedule *this)

{
  *(undefined ***)&this->field_0x1d8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1e0 = 0;
  *(char **)&this->field_0x1e8 = "IfcCostSchedule";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__007c2368);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7c2288;
  *(undefined8 *)&this->field_0x1d8 = 0x7c2350;
  *(undefined8 *)&this->field_0x88 = 0x7c22b0;
  *(undefined8 *)&this->field_0x98 = 0x7c22d8;
  *(undefined8 *)&this->field_0xd0 = 0x7c2300;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>)._vptr_ObjectHelper =
       (_func_int **)0x7c2328;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCostSchedule,_8UL>).field_0x20 = 0;
  (this->PreparedBy).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->PreparedBy).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->PreparedBy).have = false;
  (this->SubmittedOn).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->SubmittedOn).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->SubmittedOn).have = false;
  (this->Status).ptr._M_dataplus._M_p = (pointer)&(this->Status).ptr.field_2;
  (this->Status).ptr._M_string_length = 0;
  (this->Status).ptr.field_2._M_local_buf[0] = '\0';
  (this->Status).have = false;
  *(undefined8 *)
   ((long)&(this->TargetUsers).ptr.
           super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           .
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->TargetUsers).ptr.
           super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           .
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->TargetUsers).ptr.
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TargetUsers).ptr.
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UpdateDate).have = false;
  (this->UpdateDate).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->UpdateDate).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ID)._M_dataplus._M_p = (pointer)&(this->ID).field_2;
  (this->ID)._M_string_length = 0;
  (this->ID).field_2._M_local_buf[0] = '\0';
  (this->PredefinedType)._M_dataplus._M_p = (pointer)&(this->PredefinedType).field_2;
  (this->PredefinedType)._M_string_length = 0;
  (this->PredefinedType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcCostSchedule() : Object("IfcCostSchedule") {}